

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessfilebackend.cpp
# Opt level: O0

bool __thiscall QNetworkAccessFileBackend::loadFileInfo(QNetworkAccessFileBackend *this)

{
  longlong lVar1;
  ulong uVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  QFileInfo fi;
  undefined4 in_stack_ffffffffffffff28;
  KnownHeaders in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  int in_stack_ffffffffffffff44;
  QString *a;
  undefined1 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff51;
  byte bVar4;
  undefined6 in_stack_ffffffffffffff52;
  QUrl local_a8;
  undefined1 local_a0 [24];
  char local_88 [6];
  QChar in_stack_ffffffffffffff7e;
  QDateTime local_58 [8];
  undefined8 local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0xaaaaaaaaaaaaaaaa;
  a = in_RDI;
  QFileInfo::QFileInfo((QFileInfo *)&local_50,(QFileDevice *)&(in_RDI->d).size);
  QFileInfo::lastModified
            ((QFileInfo *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  QVariant::QVariant(&local_28,local_58);
  QNetworkAccessBackend::setHeader
            ((QNetworkAccessBackend *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff2c,(QVariant *)0x198bfc);
  QVariant::~QVariant(&local_28);
  QDateTime::~QDateTime(local_58);
  lVar1 = QFileInfo::size();
  QVariant::QVariant(&local_48,lVar1);
  QNetworkAccessBackend::setHeader
            ((QNetworkAccessBackend *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff2c,(QVariant *)0x198c4a);
  QVariant::~QVariant(&local_48);
  QNetworkAccessBackend::metaDataChanged((QNetworkAccessBackend *)0x198c61);
  uVar2 = QFileInfo::isDir();
  bVar3 = (uVar2 & 1) != 0;
  if (bVar3) {
    QCoreApplication::translate
              (local_88,"QNetworkAccessFileBackend","Cannot open %1: Path is a directory",0);
    QNetworkAccessBackend::url((QNetworkAccessBackend *)in_RDI);
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)
               &stack0xffffffffffffff54,PrettyDecoded);
    QUrl::toString((QUrlTwoFlags_conflict1 *)local_a0);
    QChar::QChar<char16_t,_true>((QChar *)&stack0xffffffffffffff52,L' ');
    QString::arg<QString,_true>
              ((QString *)
               CONCAT62(in_stack_ffffffffffffff52,
                        CONCAT11(in_stack_ffffffffffffff51,in_stack_ffffffffffffff50)),a,
               in_stack_ffffffffffffff44,in_stack_ffffffffffffff7e);
    QNetworkAccessBackend::error
              ((QNetworkAccessBackend *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff2c,(QString *)0x198d06);
    QString::~QString((QString *)0x198d10);
    QString::~QString((QString *)0x198d1a);
    QUrl::~QUrl(&local_a8);
    QString::~QString((QString *)0x198d2e);
    QNetworkAccessBackend::finished((QNetworkAccessBackend *)0x198d38);
  }
  bVar4 = !bVar3;
  QFileInfo::~QFileInfo((QFileInfo *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool QNetworkAccessFileBackend::loadFileInfo()
{
    QFileInfo fi(file);
    setHeader(QNetworkRequest::LastModifiedHeader, fi.lastModified());
    setHeader(QNetworkRequest::ContentLengthHeader, fi.size());

    // signal we're open
    metaDataChanged();

    if (fi.isDir()) {
        error(QNetworkReply::ContentOperationNotPermittedError,
              QCoreApplication::translate("QNetworkAccessFileBackend", "Cannot open %1: Path is a directory").arg(url().toString()));
        finished();
        return false;
    }

    return true;
}